

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderPackingFunctionTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::PackUnorm2x16Case::iterate(PackUnorm2x16Case *this)

{
  float fVar1;
  Precision PVar2;
  uint uVar3;
  ShaderExecutor *pSVar4;
  float fVar5;
  int iVar6;
  deUint32 dVar7;
  int iVar8;
  int iVar9;
  char *description;
  int iVar10;
  int iVar11;
  PackUnorm2x16Case *pPVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  float fVar17;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> inputs;
  void *out;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outputs;
  Random rnd;
  void *in;
  float local_228 [2];
  long lStack_220;
  long local_218;
  PackUnorm2x16Case *local_208;
  pointer local_200;
  Hex<8UL> local_1f8;
  int local_1ec;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  long local_1d0;
  ulong local_1c8;
  deRandom local_1c0;
  undefined1 local_1b0 [8];
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  dVar7 = deStringHash((this->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&local_1c0,dVar7 ^ 0x776002);
  local_218 = 0;
  local_228[0] = 0.0;
  local_228[1] = 0.0;
  lStack_220 = 0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  PVar2 = this->m_precision;
  if (PVar2 == PRECISION_MEDIUMP) {
    iVar11 = 0x41;
  }
  else {
    iVar11 = 1;
    if ((PVar2 != PRECISION_HIGHP) && (iVar11 = 0x101, PVar2 != PRECISION_LOWP)) {
      iVar11 = 0;
    }
  }
  local_1b0._0_4_ = 0.0;
  local_1b0._4_4_ = 0.0;
  local_208 = this;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_228,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = 0.5;
  local_1b0._4_4_ = 1.0;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_228,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = 1.0;
  local_1b0._4_4_ = 0.5;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_228,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = -0.5;
  local_1b0._4_4_ = 1.5;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_228,
             (Vector<float,_2> *)local_1b0);
  local_1b0._0_4_ = 0.25;
  local_1b0._4_4_ = 0.75;
  std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
  emplace_back<tcu::Vector<float,2>>
            ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_228,
             (Vector<float,_2> *)local_1b0);
  iVar10 = 0xf;
  do {
    fVar17 = deRandom_getFloat(&local_1c0);
    local_200 = (pointer)CONCAT44(local_200._4_4_,fVar17);
    fVar17 = deRandom_getFloat(&local_1c0);
    local_1b0._4_4_ = fVar17 * 1.25;
    local_1b0._0_4_ = local_200._0_4_ * 1.25;
    std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
    emplace_back<tcu::Vector<float,2>>
              ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_228,
               (Vector<float,_2> *)local_1b0);
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  iVar10 = 0x50;
  do {
    fVar17 = deRandom_getFloat(&local_1c0);
    local_200 = (pointer)CONCAT44(local_200._4_4_,fVar17);
    fVar17 = deRandom_getFloat(&local_1c0);
    local_1b0._4_4_ = fVar17 * 1e+06 + -100000.0;
    local_1b0._0_4_ = local_200._0_4_ * 1e+06 + -100000.0;
    std::vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>>::
    emplace_back<tcu::Vector<float,2>>
              ((vector<tcu::Vector<float,2>,std::allocator<tcu::Vector<float,2>>> *)local_228,
               (Vector<float,_2> *)local_1b0);
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&local_1e8,lStack_220 - (long)local_228 >> 3);
  local_1b0 = (undefined1  [8])
              ((local_208->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
               super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"Executing shader for ",0x15);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," input values",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  pPVar12 = local_208;
  local_1b0._0_4_ = local_228[0];
  local_1b0._4_4_ = local_228[1];
  local_1f8.value =
       (deUint64)
       local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start;
  (*((local_208->super_ShaderPackingFunctionCase).m_executor)->_vptr_ShaderExecutor[5])();
  pSVar4 = (pPVar12->super_ShaderPackingFunctionCase).m_executor;
  (*pSVar4->_vptr_ShaderExecutor[6])
            (pSVar4,(ulong)(lStack_220 - (long)local_228) >> 3,local_1b0,&local_1f8);
  local_1c8 = (ulong)(lStack_220 - (long)local_228) >> 3;
  pPVar12 = local_208;
  if ((int)local_1c8 < 1) {
    iVar10 = 0;
  }
  else {
    lVar13 = 0;
    lVar14 = 0;
    iVar10 = 0;
    do {
      fVar17 = *(float *)((long)local_228 + lVar14 * 8);
      fVar1 = *(float *)((long)local_228 + 4 + lVar14 * 8);
      fVar5 = 1.0;
      if (fVar17 <= 1.0) {
        fVar5 = fVar17;
      }
      fVar17 = (float)(~-(uint)(fVar17 < 0.0) & (uint)(fVar5 * 65535.0));
      uVar15 = -(uint)(fVar17 < 0.0);
      uVar15 = (uint)((float)(~uVar15 & 0x3f000000 | uVar15 & 0xbf000000) + fVar17);
      if (0xfffe < (int)uVar15) {
        uVar15 = 0xffff;
      }
      if ((int)uVar15 < 1) {
        uVar15 = 0;
      }
      fVar17 = 1.0;
      if (fVar1 <= 1.0) {
        fVar17 = fVar1;
      }
      fVar17 = (float)(~-(uint)(fVar1 < 0.0) & (uint)(fVar17 * 65535.0));
      uVar16 = -(uint)(fVar17 < 0.0);
      uVar16 = (uint)((float)(~uVar16 & 0x3f000000 | uVar16 & 0xbf000000) + fVar17);
      if (0xfffe < (int)uVar16) {
        uVar16 = 0xffff;
      }
      if ((int)uVar16 < 1) {
        uVar16 = 0;
      }
      uVar3 = local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar14];
      local_200 = (pointer)(ulong)uVar3;
      iVar9 = uVar15 - (uVar3 & 0xffff);
      iVar6 = -iVar9;
      if (0 < iVar9) {
        iVar6 = iVar9;
      }
      iVar8 = uVar16 - (uVar3 >> 0x10);
      iVar9 = -iVar8;
      if (0 < iVar8) {
        iVar9 = iVar8;
      }
      if ((iVar11 < iVar6) || (iVar11 < iVar9)) {
        if (iVar10 < 10) {
          local_1b0 = (undefined1  [8])
                      ((pPVar12->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log;
          local_1ec = iVar10;
          local_1d0 = lVar13;
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"ERROR: Mismatch in value ",0x19);
          std::ostream::operator<<(local_1a8,(int)lVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,", expected packUnorm2x16(",0x19);
          tcu::operator<<((ostream *)local_1a8,(Vector<float,_2> *)((long)local_228 + local_1d0));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,") = ",4);
          local_1f8.value = (deUint64)(uVar16 << 0x10 | uVar15);
          tcu::Format::Hex<8UL>::toStream(&local_1f8,(ostream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", got ",6);
          local_1f8.value = (deUint64)local_200;
          tcu::Format::Hex<8UL>::toStream(&local_1f8,(ostream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\n  diffs = (",0xc);
          std::ostream::operator<<(local_1a8,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
          std::ostream::operator<<(local_1a8,iVar9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"), max diff = ",0xe);
          std::ostream::operator<<(local_1a8,iVar11);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          std::ios_base::~ios_base(local_138);
          pPVar12 = local_208;
          lVar13 = local_1d0;
          iVar10 = local_1ec;
        }
        else if (iVar10 == 10) {
          local_1b0 = (undefined1  [8])
                      ((pPVar12->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
                       super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"...",3);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(local_1a8);
          std::ios_base::~ios_base(local_138);
          pPVar12 = local_208;
        }
        iVar10 = iVar10 + 1;
      }
      lVar14 = lVar14 + 1;
      lVar13 = lVar13 + 8;
    } while (lVar14 < (int)((ulong)(lStack_220 - (long)local_228) >> 3));
  }
  local_1b0 = (undefined1  [8])
              ((pPVar12->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
               super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  iVar11 = (int)local_1c8;
  std::ostream::operator<<(local_1a8,iVar11 - iVar10);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," / ",3);
  std::ostream::operator<<(local_1a8,iVar11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  description = "Pass";
  if (iVar10 != 0) {
    description = "Result comparison failed";
  }
  tcu::TestContext::setTestResult
            ((local_208->super_ShaderPackingFunctionCase).super_TestCase.super_TestCase.
             super_TestNode.m_testCtx,(uint)(iVar10 != 0),description);
  if (local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_228 != (float  [2])0x0) {
    operator_delete((void *)local_228,local_218 - (long)local_228);
  }
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		de::Random					rnd			(deStringHash(getName()) ^ 0x776002);
		std::vector<tcu::Vec2>		inputs;
		std::vector<deUint32>		outputs;
		const int					maxDiff		= m_precision == glu::PRECISION_HIGHP	? 1		:		// Rounding only.
												  m_precision == glu::PRECISION_MEDIUMP	? 65	:		// (2^-10) * (2^16) + 1
												  m_precision == glu::PRECISION_LOWP	? 257	: 0;	// (2^-8) * (2^16) + 1

		// Special values to check.
		inputs.push_back(tcu::Vec2(0.0f, 0.0f));
		inputs.push_back(tcu::Vec2(0.5f, 1.0f));
		inputs.push_back(tcu::Vec2(1.0f, 0.5f));
		inputs.push_back(tcu::Vec2(-0.5f, 1.5f));
		inputs.push_back(tcu::Vec2(0.25f, 0.75f));

		// Random values, mostly in range.
		for (int ndx = 0; ndx < 15; ndx++)
		{
			const float x = rnd.getFloat()*1.25f;
			const float y = rnd.getFloat()*1.25f;
			inputs.push_back(tcu::Vec2(x, y));
		}

		// Large random values.
		for (int ndx = 0; ndx < 80; ndx++)
		{
			const float x = rnd.getFloat()*1e6f - 1e5f;
			const float y = rnd.getFloat()*1e6f - 1e5f;
			inputs.push_back(tcu::Vec2(x, y));
		}

		outputs.resize(inputs.size());

		m_testCtx.getLog() << TestLog::Message << "Executing shader for " << inputs.size() << " input values" << tcu::TestLog::EndMessage;

		{
			const void*	in	= &inputs[0];
			void*		out	= &outputs[0];

			m_executor->useProgram();
			m_executor->execute((int)inputs.size(), &in, &out);
		}

		// Verify
		{
			const int	numValues	= (int)inputs.size();
			const int	maxPrints	= 10;
			int			numFailed	= 0;

			for (int valNdx = 0; valNdx < (int)inputs.size(); valNdx++)
			{
				const deUint16	ref0	= (deUint16)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].x(), 0.0f, 1.0f) * 65535.0f), 0, (1<<16)-1);
				const deUint16	ref1	= (deUint16)de::clamp(deRoundFloatToInt32(de::clamp(inputs[valNdx].y(), 0.0f, 1.0f) * 65535.0f), 0, (1<<16)-1);
				const deUint32	ref		= (ref1 << 16) | ref0;
				const deUint32	res		= outputs[valNdx];
				const deUint16	res0	= (deUint16)(res & 0xffff);
				const deUint16	res1	= (deUint16)(res >> 16);
				const int		diff0	= de::abs((int)ref0 - (int)res0);
				const int		diff1	= de::abs((int)ref1 - (int)res1);

				if (diff0 > maxDiff || diff1 > maxDiff)
				{
					if (numFailed < maxPrints)
					{
						m_testCtx.getLog() << TestLog::Message << "ERROR: Mismatch in value " << valNdx
															   << ", expected packUnorm2x16(" << inputs[valNdx] << ") = " << tcu::toHex(ref)
															   << ", got " << tcu::toHex(res)
															   << "\n  diffs = (" << diff0 << ", " << diff1 << "), max diff = " << maxDiff
										   << TestLog::EndMessage;
					}
					else if (numFailed == maxPrints)
						m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

					numFailed += 1;
				}
			}

			m_testCtx.getLog() << TestLog::Message << (numValues - numFailed) << " / " << numValues << " values passed" << TestLog::EndMessage;

			m_testCtx.setTestResult(numFailed == 0 ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									numFailed == 0 ? "Pass"					: "Result comparison failed");
		}

		return STOP;
	}